

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

void writeDeepTiled(DeepTiledOutputPart *out,DeepFrameBuffer *buf,
                   vector<double,_std::allocator<double>_> *perf)

{
  int iVar1;
  int iVar2;
  time_point in_RDX;
  time_point in_RDI;
  time_point endWrite;
  time_point startWrite;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  
  Imf_3_4::DeepTiledOutputPart::setFrameBuffer((DeepFrameBuffer *)in_RDI.__d.__r);
  std::chrono::_V2::steady_clock::now();
  iVar2 = SUB84(in_RDI.__d.__r,0);
  iVar1 = Imf_3_4::DeepTiledOutputPart::numXTiles(iVar2);
  iVar2 = Imf_3_4::DeepTiledOutputPart::numYTiles(iVar2);
  uVar3 = 0;
  Imf_3_4::DeepTiledOutputPart::writeTiles(SUB84(in_RDI.__d.__r,0),0,iVar1 + -1,0,iVar2 + -1,0);
  if (in_RDX.__d.__r != 0) {
    std::chrono::_V2::steady_clock::now();
    timing(in_RDI,in_RDX);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffffa0,
               (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff9c,uVar3));
  }
  return;
}

Assistant:

void
writeDeepTiled (
    DeepTiledOutputPart& out, DeepFrameBuffer& buf, vector<double>* perf)
{
    out.setFrameBuffer (buf);
    steady_clock::time_point startWrite = steady_clock::now ();
    out.writeTiles (0, out.numXTiles (0) - 1, 0, out.numYTiles (0) - 1, 0, 0);

    if (perf)
    {
        steady_clock::time_point endWrite = steady_clock::now ();
        perf->push_back (timing (startWrite, endWrite));
    }
}